

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O3

void CreateBackwardReferencesNH2
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals,
               BackwardReferenceFromDecoder *backward_references,size_t *back_refs_position,
               size_t back_refs_size)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  uint8_t uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ushort uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  ushort uVar26;
  ulong uVar27;
  uint uVar28;
  size_t sVar29;
  ulong uVar30;
  int *piVar31;
  ulong uVar32;
  char *pcVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  long local_f0;
  ulong local_d8;
  size_t *local_d0;
  ulong local_c8;
  ulong local_b8;
  ulong local_a0;
  uint local_70;
  
  uVar4 = (position - 7) + num_bytes;
  sVar29 = position;
  if (7 < num_bytes) {
    sVar29 = uVar4;
  }
  lVar35 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar35 = 0x40;
  }
  uVar34 = *(ulong *)dist_cache;
  uVar1 = position + num_bytes;
  if (uVar1 <= position + 8) {
    local_d0 = last_insert_len;
LAB_00110baa:
    *(ulong *)dist_cache = (uVar34 + uVar1) - position;
    *(long *)commands = *(long *)commands + ((long)local_d0 - (long)last_insert_len >> 4);
    return;
  }
  uVar21 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  lVar6 = *(long *)(literal_context_lut + 0x10);
  local_b8 = lVar35 + position;
  lVar7 = *(long *)&(params->hasher).num_last_distances_to_check;
  lVar3 = position - 1;
  local_d0 = last_insert_len;
  uVar14 = position;
LAB_0010fd85:
  uVar30 = uVar1 - uVar14;
  uVar23 = uVar21;
  if (uVar14 < uVar21) {
    uVar23 = uVar14;
  }
  uVar13 = lVar6 + uVar14;
  if (uVar21 <= lVar6 + uVar14) {
    uVar13 = uVar21;
  }
  uVar8 = *(ulong *)(literal_context_lut + 0x50);
  uVar27 = uVar14 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar27);
  uVar5 = ringbuffer[uVar27];
  uVar40 = (ulong)(*(long *)(ringbuffer + uVar27) * -0x42e1ca5843000000) >> 0x30;
  local_c8 = (ulong)*(int *)&(hasher->common).extra;
  local_70 = (uint)ringbuffer_mask;
  if ((uVar14 - local_c8 < uVar14) &&
     (uVar22 = (ulong)((uint)(uVar14 - local_c8) & local_70), uVar5 == ringbuffer[uVar22])) {
    if (7 < uVar30) {
      local_d8 = uVar30 & 0xfffffffffffffff8;
      piVar31 = (int *)(ringbuffer + local_d8 + uVar27);
      lVar37 = 0;
      uVar25 = 0;
LAB_0010fe2e:
      if (*(ulong *)(piVar2 + uVar25 * 2) == *(ulong *)(ringbuffer + uVar25 * 8 + uVar22))
      goto code_r0x0010fe40;
      uVar25 = *(ulong *)(ringbuffer + uVar25 * 8 + uVar22) ^ *(ulong *)(piVar2 + uVar25 * 2);
      uVar22 = 0;
      if (uVar25 != 0) {
        for (; (uVar25 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
        }
      }
      uVar25 = (uVar22 >> 3 & 0x1fffffff) - lVar37;
      goto LAB_0010fe87;
    }
    local_d8 = 0;
    piVar31 = piVar2;
LAB_00110b02:
    uVar41 = uVar30 & 7;
    uVar25 = local_d8;
    if (uVar41 != 0) {
      uVar39 = local_d8 | uVar41;
      do {
        uVar25 = local_d8;
        if (ringbuffer[local_d8 + uVar22] != (uint8_t)*piVar31) break;
        piVar31 = (int *)((long)piVar31 + 1);
        local_d8 = local_d8 + 1;
        uVar41 = uVar41 - 1;
        uVar25 = uVar39;
      } while (uVar41 != 0);
    }
LAB_0010fe87:
    if ((3 < uVar25) && (uVar22 = uVar25 * 0x87 + 0x78f, 0x7e4 < uVar22)) {
      *(int *)(lVar7 + uVar40 * 4) = (int)uVar14;
      iVar20 = 0;
      goto LAB_0010ffa9;
    }
  }
  uVar28 = *(uint *)(lVar7 + uVar40 * 4);
  *(int *)(lVar7 + uVar40 * 4) = (int)uVar14;
  uVar40 = (ulong)(local_70 & uVar28);
  if (((uVar5 == ringbuffer[uVar40]) && (uVar14 != uVar28)) &&
     (local_c8 = uVar14 - uVar28, local_c8 <= uVar23)) {
    if (7 < uVar30) {
      uVar23 = uVar30 & 0xfffffffffffffff8;
      piVar31 = (int *)(ringbuffer + uVar23 + uVar27);
      lVar37 = 0;
      uVar27 = 0;
LAB_0010ff28:
      if (*(ulong *)(piVar2 + uVar27 * 2) == *(ulong *)(ringbuffer + uVar27 * 8 + uVar40))
      goto code_r0x0010ff35;
      uVar27 = *(ulong *)(ringbuffer + uVar27 * 8 + uVar40) ^ *(ulong *)(piVar2 + uVar27 * 2);
      uVar23 = 0;
      if (uVar27 != 0) {
        for (; (uVar27 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
        }
      }
      uVar25 = (uVar23 >> 3 & 0x1fffffff) - lVar37;
      goto LAB_0010ff79;
    }
    uVar23 = 0;
    piVar31 = piVar2;
LAB_00110abf:
    uVar27 = uVar30 & 7;
    uVar25 = uVar23;
    if (uVar27 != 0) {
      uVar22 = uVar23 | uVar27;
      do {
        uVar25 = uVar23;
        if (ringbuffer[uVar23 + uVar40] != (uint8_t)*piVar31) break;
        piVar31 = (int *)((long)piVar31 + 1);
        uVar23 = uVar23 + 1;
        uVar27 = uVar27 - 1;
        uVar25 = uVar22;
      } while (uVar27 != 0);
    }
LAB_0010ff79:
    if (3 < uVar25) {
      iVar20 = 0x1f;
      if ((uint)local_c8 != 0) {
        for (; (uint)local_c8 >> iVar20 == 0; iVar20 = iVar20 + -1) {
        }
      }
      uVar22 = (ulong)(iVar20 * -0x1e + 0x780) + uVar25 * 0x87;
      iVar20 = 0;
      if (0x7e4 < uVar22) goto LAB_0010ffa9;
    }
    lVar37 = *(long *)&(params->hasher).block_bits;
    if (*(ulong *)(lVar37 + 0x10) < *(ulong *)(lVar37 + 8) >> 7) goto LAB_00110523;
    uVar27 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x12);
    lVar9 = *(long *)(literal_context_lut + 0x78);
    *(ulong *)(lVar37 + 8) = *(ulong *)(lVar37 + 8) + 1;
    bVar15 = *(byte *)(lVar9 + uVar27 * 2);
    uVar23 = (ulong)bVar15;
    if ((uVar23 == 0) || (uVar30 < uVar23)) goto LAB_00110523;
    uVar27 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar27 * 4);
    lVar9 = *(long *)(literal_context_lut + 0x58);
    pcVar33 = (char *)(uVar27 * uVar23 + *(long *)(lVar9 + 0xa8) +
                      (ulong)*(uint *)(lVar9 + 0x20 + uVar23 * 4));
    if (7 < bVar15) {
      uVar40 = (ulong)(bVar15 & 0xfffffff8);
      lVar17 = 0;
      uVar22 = 0;
LAB_00110786:
      if (*(ulong *)(pcVar33 + uVar22 * 8) == *(ulong *)(piVar2 + uVar22 * 2))
      goto code_r0x00110793;
      uVar22 = *(ulong *)(piVar2 + uVar22 * 2) ^ *(ulong *)(pcVar33 + uVar22 * 8);
      uVar40 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
        }
      }
      uVar25 = (uVar40 >> 3 & 0x1fffffff) - lVar17;
      goto LAB_001107c9;
    }
    uVar40 = 0;
    goto LAB_00110b41;
  }
  goto LAB_00110523;
code_r0x0010fe40:
  uVar25 = uVar25 + 1;
  lVar37 = lVar37 + -8;
  if (uVar30 >> 3 == uVar25) goto LAB_00110b02;
  goto LAB_0010fe2e;
code_r0x0010ff35:
  uVar27 = uVar27 + 1;
  lVar37 = lVar37 + -8;
  if (uVar30 >> 3 == uVar27) goto LAB_00110abf;
  goto LAB_0010ff28;
code_r0x00110793:
  uVar22 = uVar22 + 1;
  lVar17 = lVar17 + -8;
  if (bVar15 >> 3 == uVar22) goto code_r0x0011079f;
  goto LAB_00110786;
code_r0x0011079f:
  pcVar33 = pcVar33 + -lVar17;
LAB_00110b41:
  uVar22 = uVar23 & 7;
  uVar25 = uVar40;
  if ((bVar15 & 7) != 0) {
    uVar41 = uVar40 | uVar22;
    do {
      uVar25 = uVar40;
      if (*(char *)((long)piVar2 + uVar40) != *pcVar33) break;
      pcVar33 = pcVar33 + 1;
      uVar40 = uVar40 + 1;
      uVar22 = uVar22 - 1;
      uVar25 = uVar41;
    } while (uVar22 != 0);
  }
LAB_001107c9:
  if (((uVar25 != 0) && (uVar23 < *(uint *)(literal_context_lut + 100) + uVar25)) &&
     (local_c8 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                                ((char)(uVar23 - uVar25) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar23 - uVar25) * 4 << (*(byte *)(lVar9 + uVar23) & 0x3f)) + uVar13 + 1 + uVar27
     , local_c8 <= uVar8)) {
    iVar20 = 0x1f;
    if ((uint)local_c8 != 0) {
      for (; (uint)local_c8 >> iVar20 == 0; iVar20 = iVar20 + -1) {
      }
    }
    uVar22 = (uVar25 * 0x87 - (ulong)(uint)(iVar20 * 0x1e)) + 0x780;
    if ((0x7e3 < uVar22) &&
       (*(ulong *)(lVar37 + 0x10) = *(ulong *)(lVar37 + 0x10) + 1, uVar22 != 0x7e4)) {
      iVar20 = (uint)bVar15 - (int)uVar25;
LAB_0010ffa9:
      uVar13 = (ulong)*(int *)&(hasher->common).extra;
      uVar27 = (lVar3 + num_bytes) - uVar14;
      iVar12 = 0;
      uVar23 = uVar34;
LAB_0010ffd7:
      uVar30 = uVar30 - 1;
      uVar40 = uVar25 - 1;
      if (uVar30 <= uVar25 - 1) {
        uVar40 = uVar30;
      }
      if (4 < *(int *)(literal_context_lut + 4)) {
        uVar40 = 0;
      }
      uVar41 = uVar14 + 1;
      uVar39 = uVar21;
      if (uVar41 < uVar21) {
        uVar39 = uVar41;
      }
      local_a0 = lVar6 + uVar14 + 1;
      if (uVar21 <= local_a0) {
        local_a0 = uVar21;
      }
      piVar2 = (int *)(ringbuffer + (uVar41 & ringbuffer_mask));
      uVar5 = *(uint8_t *)(uVar40 + (long)piVar2);
      uVar38 = (ulong)(*(long *)(ringbuffer + (uVar41 & ringbuffer_mask)) * -0x42e1ca5843000000) >>
               0x30;
      uVar32 = uVar41 - uVar13;
      if ((uVar32 < uVar41) &&
         (uVar28 = (uint)uVar32 & local_70, uVar5 == ringbuffer[uVar40 + uVar28])) {
        if (7 < uVar30) {
          local_f0 = 0;
          uVar32 = 0;
LAB_0011009f:
          if (*(ulong *)(piVar2 + uVar32 * 2) == *(ulong *)(ringbuffer + uVar32 * 8 + (ulong)uVar28)
             ) goto code_r0x001100b1;
          uVar18 = *(ulong *)(ringbuffer + uVar32 * 8 + (ulong)uVar28) ^
                   *(ulong *)(piVar2 + uVar32 * 2);
          uVar32 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
            }
          }
          uVar32 = (uVar32 >> 3 & 0x1fffffff) - local_f0;
          goto LAB_001100e8;
        }
        uVar32 = 0;
        piVar31 = piVar2;
        goto LAB_00110455;
      }
      goto LAB_00110129;
    }
  }
LAB_00110523:
  uVar34 = uVar34 + 1;
  position = uVar14 + 1;
  if ((num_literals == (size_t *)0x0) && (local_b8 < position)) {
    if ((uint)((int)lVar35 * 4) + local_b8 < position) {
      uVar23 = uVar14 + 0x11;
      if (uVar4 <= uVar14 + 0x11) {
        uVar23 = uVar4;
      }
      for (; position < uVar23; position = position + 4) {
        *(int *)(lVar7 + ((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                                 -0x42e1ca5843000000) >> 0x30) * 4) = (int)position;
        uVar34 = uVar34 + 4;
      }
    }
    else {
      uVar23 = uVar14 + 9;
      if (uVar4 <= uVar14 + 9) {
        uVar23 = uVar4;
      }
      for (; position < uVar23; position = position + 2) {
        *(int *)(lVar7 + ((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                                 -0x42e1ca5843000000) >> 0x30) * 4) = (int)position;
        uVar34 = uVar34 + 2;
      }
    }
  }
  goto LAB_00110a4f;
code_r0x001100b1:
  uVar32 = uVar32 + 1;
  local_f0 = local_f0 + -8;
  if (uVar27 >> 3 == uVar32) goto code_r0x001100bf;
  goto LAB_0011009f;
code_r0x001100bf:
  uVar32 = -local_f0;
  piVar31 = (int *)((long)piVar2 - local_f0);
LAB_00110455:
  uVar18 = uVar30 & 7;
  for (; (uVar18 != 0 && (ringbuffer[uVar32 + uVar28] == (uint8_t)*piVar31)); uVar32 = uVar32 + 1) {
    piVar31 = (int *)((long)piVar31 + 1);
    uVar18 = uVar18 - 1;
  }
LAB_001100e8:
  if ((uVar32 < 4) || (uVar18 = uVar32 * 0x87 + 0x78f, uVar18 < 0x7e5)) {
LAB_00110129:
    uVar28 = *(uint *)(lVar7 + uVar38 * 4);
    *(int *)(lVar7 + uVar38 * 4) = (int)uVar41;
    uVar19 = local_70 & uVar28;
    if (uVar5 == ringbuffer[uVar40 + uVar19]) {
      if ((uVar41 != uVar28) && (uVar40 = uVar41 - uVar28, uVar40 <= uVar39)) {
        if (7 < uVar30) {
          lVar37 = 0;
          uVar39 = 0;
LAB_0011017b:
          if (*(ulong *)(piVar2 + uVar39 * 2) == *(ulong *)(ringbuffer + uVar39 * 8 + (ulong)uVar19)
             ) goto code_r0x0011018d;
          uVar32 = *(ulong *)(ringbuffer + uVar39 * 8 + (ulong)uVar19) ^
                   *(ulong *)(piVar2 + uVar39 * 2);
          uVar39 = 0;
          if (uVar32 != 0) {
            for (; (uVar32 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
            }
          }
          uVar32 = (uVar39 >> 3 & 0x1fffffff) - lVar37;
          goto LAB_001101d7;
        }
        uVar32 = 0;
        piVar31 = piVar2;
        goto LAB_0011041f;
      }
      goto LAB_001103f2;
    }
    uVar18 = 0x7e4;
    uVar40 = 0;
    uVar32 = 0;
  }
  else {
    *(int *)(lVar7 + uVar38 * 4) = (int)uVar41;
    uVar40 = uVar13;
  }
  iVar16 = 0;
LAB_00110258:
  if (uVar18 < uVar22 + 0xaf) {
    uVar32 = uVar25;
    uVar41 = uVar14;
    uVar39 = uVar23;
    uVar40 = local_c8;
    iVar16 = iVar20;
    local_a0 = uVar14 + lVar6;
    if (uVar21 <= uVar14 + lVar6) {
      local_a0 = uVar21;
    }
    goto LAB_00110612;
  }
  uVar39 = uVar34 + 4;
  if (iVar12 == 3) goto LAB_00110612;
  uVar39 = uVar23 + 1;
  iVar12 = iVar12 + 1;
  uVar38 = uVar14 + 9;
  uVar27 = uVar27 - 1;
  uVar22 = uVar18;
  uVar14 = uVar41;
  uVar25 = uVar32;
  uVar23 = uVar39;
  local_c8 = uVar40;
  iVar20 = iVar16;
  if (uVar1 <= uVar38) goto LAB_00110612;
  goto LAB_0010ffd7;
code_r0x0011018d:
  uVar39 = uVar39 + 1;
  lVar37 = lVar37 + -8;
  if (uVar27 >> 3 == uVar39) goto code_r0x00110199;
  goto LAB_0011017b;
code_r0x00110199:
  uVar32 = -lVar37;
  piVar31 = (int *)((long)piVar2 - lVar37);
LAB_0011041f:
  uVar39 = uVar30 & 7;
  for (; (uVar39 != 0 && (ringbuffer[uVar32 + uVar19] == (uint8_t)*piVar31)); uVar32 = uVar32 + 1) {
    piVar31 = (int *)((long)piVar31 + 1);
    uVar39 = uVar39 - 1;
  }
LAB_001101d7:
  iVar16 = 0;
  if (3 < uVar32) {
    iVar10 = 0x1f;
    if ((uint)uVar40 != 0) {
      for (; (uint)uVar40 >> iVar10 == 0; iVar10 = iVar10 + -1) {
      }
    }
    uVar18 = (ulong)(iVar10 * -0x1e + 0x780) + uVar32 * 0x87;
    if (0x7e4 < uVar18) goto LAB_00110258;
  }
  lVar37 = *(long *)&(params->hasher).block_bits;
  if (*(ulong *)(lVar37 + 8) >> 7 <= *(ulong *)(lVar37 + 0x10)) {
    uVar40 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x12);
    lVar9 = *(long *)(literal_context_lut + 0x78);
    *(ulong *)(lVar37 + 8) = *(ulong *)(lVar37 + 8) + 1;
    bVar15 = *(byte *)(lVar9 + uVar40 * 2);
    uVar39 = (ulong)bVar15;
    if ((uVar39 != 0) && (uVar39 <= uVar30)) {
      uVar40 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar40 * 4);
      lVar9 = *(long *)(literal_context_lut + 0x58);
      pcVar33 = (char *)(uVar40 * uVar39 + *(long *)(lVar9 + 0xa8) +
                        (ulong)*(uint *)(lVar9 + 0x20 + uVar39 * 4));
      if (7 < bVar15) {
        uVar38 = (ulong)(bVar15 & 0xfffffff8);
        lVar17 = 0;
        uVar32 = 0;
LAB_001102f1:
        if (*(ulong *)(pcVar33 + uVar32 * 8) == *(ulong *)(piVar2 + uVar32 * 2))
        goto code_r0x00110302;
        uVar38 = *(ulong *)(piVar2 + uVar32 * 2) ^ *(ulong *)(pcVar33 + uVar32 * 8);
        uVar32 = 0;
        if (uVar38 != 0) {
          for (; (uVar38 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
          }
        }
        uVar32 = (uVar32 >> 3 & 0x1fffffff) - lVar17;
        goto LAB_0011033a;
      }
      uVar38 = 0;
      goto LAB_00110497;
    }
  }
  iVar16 = 0;
  uVar18 = 0x7e4;
  uVar40 = 0;
  uVar32 = 0;
  goto LAB_00110258;
code_r0x00110302:
  uVar32 = uVar32 + 1;
  lVar17 = lVar17 + -8;
  if (bVar15 >> 3 == uVar32) goto code_r0x00110311;
  goto LAB_001102f1;
code_r0x00110311:
  pcVar33 = pcVar33 + -lVar17;
LAB_00110497:
  uVar18 = uVar39 & 7;
  uVar32 = uVar38;
  if ((bVar15 & 7) != 0) {
    uVar36 = uVar38 | uVar18;
    do {
      uVar32 = uVar38;
      if (*(char *)((long)piVar2 + uVar38) != *pcVar33) break;
      pcVar33 = pcVar33 + 1;
      uVar38 = uVar38 + 1;
      uVar18 = uVar18 - 1;
      uVar32 = uVar36;
    } while (uVar18 != 0);
  }
LAB_0011033a:
  if ((uVar32 != 0) && (uVar39 < *(uint *)(literal_context_lut + 100) + uVar32)) {
    uVar40 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                            ((char)(uVar39 - uVar32) * '\x06' & 0x3fU)) & 0x3f) +
              (uVar39 - uVar32) * 4 << (*(byte *)(lVar9 + uVar39) & 0x3f)) + local_a0 + 1 + uVar40;
    if (uVar40 <= uVar8) {
      iVar16 = 0x1f;
      if ((uint)uVar40 != 0) {
        for (; (uint)uVar40 >> iVar16 == 0; iVar16 = iVar16 + -1) {
        }
      }
      uVar18 = (uVar32 * 0x87 - (ulong)(uint)(iVar16 * 0x1e)) + 0x780;
      if (0x7e3 < uVar18) {
        iVar16 = (uint)bVar15 - (int)uVar32;
        *(ulong *)(lVar37 + 0x10) = *(ulong *)(lVar37 + 0x10) + 1;
        goto LAB_00110258;
      }
    }
    iVar16 = 0;
    uVar18 = 0x7e4;
    uVar40 = 0;
    uVar32 = 0;
    goto LAB_00110258;
  }
LAB_001103f2:
  uVar40 = 0;
  uVar32 = 0;
  uVar18 = 0x7e4;
  iVar16 = 0;
  goto LAB_00110258;
LAB_00110612:
  if (local_a0 < uVar40) {
LAB_00110621:
    uVar14 = uVar40 + 0xf;
LAB_00110625:
    if ((uVar40 <= local_a0) && (uVar14 != 0)) {
      *(int *)((long)&(hasher->common).dict_num_lookups + 4) =
           (int)(hasher->common).dict_num_lookups;
      *(void **)((long)&(hasher->common).extra + 4) = (hasher->common).extra;
      *(int *)&(hasher->common).extra = (int)uVar40;
    }
  }
  else {
    uVar34 = (ulong)*(int *)&(hasher->common).extra;
    if (uVar40 != uVar34) {
      uVar23 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
      uVar14 = 1;
      if (uVar40 != uVar23) {
        uVar34 = (uVar40 + 3) - uVar34;
        if (uVar34 < 7) {
          bVar15 = (byte)((int)uVar34 << 2);
          uVar28 = 0x9750468;
        }
        else {
          uVar23 = (uVar40 + 3) - uVar23;
          if (6 < uVar23) {
            uVar14 = 2;
            if ((uVar40 != (long)(int)(hasher->common).dict_num_lookups) &&
               (uVar14 = 3, uVar40 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4)))
            goto LAB_00110621;
            goto LAB_00110625;
          }
          bVar15 = (byte)((int)uVar23 << 2);
          uVar28 = 0xfdb1ace;
        }
        uVar14 = (ulong)(uVar28 >> (bVar15 & 0x1f) & 0xf);
      }
      goto LAB_00110625;
    }
    uVar14 = 0;
  }
  uVar19 = (uint)uVar39;
  *(uint *)local_d0 = uVar19;
  *(uint *)((long)local_d0 + 4) = iVar16 << 0x19 | (uint)uVar32;
  uVar34 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
  uVar28 = 0;
  if (uVar34 <= uVar14) {
    bVar15 = (byte)*(uint *)(literal_context_lut + 0x40);
    uVar23 = ((4L << (bVar15 & 0x3f)) + (uVar14 - *(uint *)(literal_context_lut + 0x44))) - 0x10;
    uVar28 = 0x1f;
    uVar24 = (uint)uVar23;
    if (uVar24 != 0) {
      for (; uVar24 >> uVar28 == 0; uVar28 = uVar28 - 1) {
      }
    }
    uVar28 = (uVar28 ^ 0xffffffe0) + 0x1f;
    uVar30 = (ulong)((uVar23 >> ((ulong)uVar28 & 0x3f) & 1) != 0);
    lVar37 = (ulong)uVar28 - (ulong)*(uint *)(literal_context_lut + 0x40);
    uVar14 = (~(-1 << (bVar15 & 0x1f)) & uVar24) + uVar34 +
             (uVar30 + lVar37 * 2 + 0xfffe << (bVar15 & 0x3f)) | lVar37 * 0x400;
    uVar28 = (uint)(uVar23 - (uVar30 + 2 << ((byte)uVar28 & 0x3f)) >> (bVar15 & 0x3f));
  }
  *(short *)((long)local_d0 + 0xe) = (short)uVar14;
  *(uint *)(local_d0 + 1) = uVar28;
  if (5 < uVar39) {
    if (uVar39 < 0x82) {
      uVar28 = 0x1f;
      uVar19 = (uint)(uVar39 - 2);
      if (uVar19 != 0) {
        for (; uVar19 >> uVar28 == 0; uVar28 = uVar28 - 1) {
        }
      }
      uVar19 = (int)(uVar39 - 2 >> ((char)(uVar28 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar28 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar39 < 0x842) {
      uVar28 = 0x1f;
      if (uVar19 - 0x42 != 0) {
        for (; uVar19 - 0x42 >> uVar28 == 0; uVar28 = uVar28 - 1) {
        }
      }
      uVar19 = (uVar28 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar19 = 0x15;
      if (0x1841 < uVar39) {
        uVar19 = (uint)(ushort)(0x17 - (uVar39 < 0x5842));
      }
    }
  }
  uVar28 = iVar16 + (uint)uVar32;
  if (uVar28 < 10) {
    uVar24 = uVar28 - 2;
  }
  else if (uVar28 < 0x86) {
    uVar28 = uVar28 - 6;
    uVar24 = 0x1f;
    if (uVar28 != 0) {
      for (; uVar28 >> uVar24 == 0; uVar24 = uVar24 - 1) {
      }
    }
    uVar24 = (uVar28 >> ((char)(uVar24 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar24 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar24 = 0x17;
    if (uVar28 < 0x846) {
      uVar24 = 0x1f;
      if (uVar28 - 0x46 != 0) {
        for (; uVar28 - 0x46 >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      uVar24 = (uVar24 ^ 0xffe0) + 0x2c;
    }
  }
  uVar11 = (ushort)uVar24;
  uVar26 = (uVar11 & 7) + ((ushort)uVar19 & 7) * 8;
  if ((((uVar14 & 0x3ff) == 0) && ((ushort)uVar19 < 8)) && (uVar11 < 0x10)) {
    if (7 < uVar11) {
      uVar26 = uVar26 | 0x40;
    }
  }
  else {
    iVar20 = ((uVar19 & 0xffff) >> 3) * 3 + ((uVar24 & 0xffff) >> 3);
    uVar26 = uVar26 + ((ushort)(0x520d40 >> ((char)iVar20 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar20 * 0x40 + 0x40;
  }
  *(ushort *)((long)local_d0 + 0xc) = uVar26;
  *num_commands = *num_commands + uVar39;
  position = uVar32 + uVar41;
  uVar34 = sVar29;
  if (position < sVar29) {
    uVar34 = position;
  }
  uVar14 = uVar41 + 2;
  if (uVar40 < uVar32 >> 2) {
    uVar23 = position + uVar40 * -4;
    if (uVar23 < uVar14) {
      uVar23 = uVar14;
    }
    uVar14 = uVar23;
    if (uVar34 < uVar23) {
      uVar14 = uVar34;
    }
  }
  local_b8 = uVar41 + lVar35 + uVar32 * 2;
  local_d0 = local_d0 + 2;
  if (uVar14 < uVar34) {
    do {
      *(int *)(lVar7 + ((ulong)(*(long *)(ringbuffer + (uVar14 & ringbuffer_mask)) *
                               -0x42e1ca5843000000) >> 0x30) * 4) = (int)uVar14;
      uVar14 = uVar14 + 1;
    } while (uVar34 != uVar14);
    uVar34 = 0;
  }
  else {
    uVar34 = 0;
  }
LAB_00110a4f:
  uVar14 = position;
  if (uVar1 <= position + 8) goto LAB_00110baa;
  goto LAB_0010fd85;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}